

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  ImFont *pIVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int compressed_ttf_size;
  ImWchar *glyph_ranges;
  ImFontConfig font_cfg;
  ImFontConfig local_a0;
  
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(&local_a0,0,0x88);
    local_a0.FontDataOwnedByAtlas = true;
    local_a0.GlyphMaxAdvanceX = 3.4028235e+38;
    local_a0.RasterizerMultiply = 1.0;
    local_a0.EllipsisChar = 0xffff;
    local_a0.OversampleH = 1;
    local_a0.OversampleV = 1;
    local_a0.PixelSnapH = true;
    compressed_ttf_size = extraout_EDX_00;
  }
  else {
    memcpy(&local_a0,font_cfg_template,0x88);
    compressed_ttf_size = extraout_EDX;
  }
  if (local_a0.SizePixels <= 0.0) {
    local_a0.SizePixels = 20.0;
  }
  if (local_a0.Name[0] == '\0') {
    ImFormatString(local_a0.Name,0x28,"Roboto-Medium.ttf, %dpx",
                   (ulong)(uint)(int)local_a0.SizePixels);
    compressed_ttf_size = extraout_EDX_01;
  }
  local_a0.EllipsisChar = 0x85;
  local_a0.GlyphOffset.y = (float)(int)(local_a0.SizePixels / 13.0);
  glyph_ranges = GetGlyphRangesDefault::ranges;
  if (local_a0.GlyphRanges != (ImWchar *)0x0) {
    glyph_ranges = local_a0.GlyphRanges;
  }
  pIVar1 = AddFontFromMemoryCompressedTTF
                     (this,roboto_medium_compressed_data,compressed_ttf_size,local_a0.SizePixels,
                      &local_a0,glyph_ranges);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.SizePixels <= 0.0f)
        font_cfg.SizePixels = 20.0f * 1.0f;
    if (font_cfg.Name[0] == '\0')
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "Roboto-Medium.ttf, %dpx", (int)font_cfg.SizePixels);
    font_cfg.EllipsisChar = (ImWchar)0x0085;
    font_cfg.GlyphOffset.y = 1.0f * IM_FLOOR(font_cfg.SizePixels / 13.0f);  // Add +1 offset per 13 units

    const ImWchar* glyph_ranges = font_cfg.GlyphRanges != NULL ? font_cfg.GlyphRanges : GetGlyphRangesDefault();
    ImFont* font = AddFontFromMemoryCompressedTTF((void*)roboto_medium_compressed_data,
            roboto_medium_compressed_size, font_cfg.SizePixels, &font_cfg, glyph_ranges);
    return font;
}